

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

bool __thiscall
t_swift_generator::struct_has_required_fields(t_swift_generator *this,t_struct *tstruct)

{
  bool bVar1;
  reference pptVar2;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  t_swift_generator *this_local;
  
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return false;
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    bVar1 = field_is_optional(this,*pptVar2);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  return true;
}

Assistant:

bool struct_has_required_fields(t_struct* tstruct) {
    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (!field_is_optional(*m_iter)) {
        return true;
      }
    }
    return false;
  }